

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O3

void NormalizeInclude(cmMakefile *mf,string *inc)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  string *psVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string local_c0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  uVar3 = std::__cxx11::string::find_first_not_of((char *)inc,0x8b1ede,0);
  lVar4 = std::__cxx11::string::find_last_not_of((char *)inc,0x8b1ede,0xffffffffffffffff);
  if (lVar4 == -1 || uVar3 == 0xffffffffffffffff) {
    inc->_M_string_length = 0;
    *(inc->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar3);
    value._M_str = (inc->_M_dataplus)._M_p;
    value._M_len = inc->_M_string_length;
    bVar2 = cmValue::IsOff(value);
    if (!bVar2) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar2 = cmsys::SystemTools::FileIsFullPath(inc);
      if ((!bVar2) &&
         (((inc->_M_string_length < 2 || (pcVar1 = (inc->_M_dataplus)._M_p, *pcVar1 != '$')) ||
          (pcVar1[1] != '<')))) {
        psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(mf);
        local_68.first._M_str = (psVar5->_M_dataplus)._M_p;
        local_68.first._M_len = psVar5->_M_string_length;
        local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_90 = local_88;
        local_a0 = 0;
        local_98 = 1;
        local_88[0] = 0x2f;
        local_50 = 1;
        local_40 = 0;
        local_30 = (inc->_M_dataplus)._M_p;
        local_38 = inc->_M_string_length;
        local_28 = 0;
        views._M_len = 3;
        views._M_array = &local_68;
        local_48 = local_90;
        cmCatViews(&local_c0,views);
        std::__cxx11::string::operator=((string *)inc,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

static void NormalizeInclude(cmMakefile& mf, std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmIsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);
    if (!cmSystemTools::FileIsFullPath(inc) &&
        !cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
      inc = cmStrCat(mf.GetCurrentSourceDirectory(), '/', inc);
    }
  }
}